

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

void __thiscall
CMU462::Face::getAxes(Face *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  double dVar1;
  pointer pVVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  long lVar9;
  _List_node_base *p_Var10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Vector3D local_30;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(axes,3);
  normal(&local_30,this);
  pVVar2 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].z = local_30.z;
  pVVar2[2].x = local_30.x;
  pVVar2[2].y = local_30.y;
  p_Var3 = (this->_halfedge)._M_node;
  lVar9 = 4;
  p_Var10 = p_Var3;
  do {
    p_Var10 = p_Var10[2]._M_next;
    lVar9 = lVar9 + -1;
  } while (p_Var3 != p_Var10);
  p_Var10 = p_Var3[2]._M_prev;
  p_Var4 = p_Var3[2]._M_next[2]._M_prev;
  if (lVar9 == 0) {
    p_Var3 = p_Var3[2]._M_next[2]._M_next;
    p_Var5 = p_Var3[2]._M_prev;
    p_Var3 = p_Var3[2]._M_next[2]._M_prev;
    dVar12 = ((double)p_Var5[1]._M_prev - (double)p_Var3[1]._M_prev) +
             ((double)p_Var4[1]._M_prev - (double)p_Var10[1]._M_prev);
    dVar13 = ((double)p_Var5[2]._M_next - (double)p_Var3[2]._M_next) +
             ((double)p_Var4[2]._M_next - (double)p_Var10[2]._M_next);
    dVar11 = ((double)p_Var5[2]._M_prev - (double)p_Var3[2]._M_prev) +
             ((double)p_Var4[2]._M_prev - (double)p_Var10[2]._M_prev);
  }
  else {
    dVar12 = (double)p_Var4[1]._M_prev - (double)p_Var10[1]._M_prev;
    dVar13 = (double)p_Var4[2]._M_next - (double)p_Var10[2]._M_next;
    dVar11 = (double)p_Var4[2]._M_prev - (double)p_Var10[2]._M_prev;
  }
  pVVar2 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pVVar2[2].z;
  dVar7 = pVVar2[2].x;
  dVar8 = pVVar2[2].y;
  dVar14 = dVar11 * dVar1 + dVar12 * dVar7 + dVar13 * dVar8;
  dVar12 = dVar12 - dVar14 * dVar7;
  dVar13 = dVar13 - dVar14 * dVar8;
  dVar11 = dVar11 - dVar1 * dVar14;
  dVar14 = 1.0 / SQRT(dVar11 * dVar11 + dVar12 * dVar12 + dVar13 * dVar13);
  dVar11 = dVar11 * dVar14;
  dVar12 = dVar14 * dVar12;
  dVar14 = dVar14 * dVar13;
  pVVar2->x = dVar12;
  pVVar2->y = dVar14;
  pVVar2->z = dVar11;
  dVar13 = dVar11 * dVar8 - dVar14 * dVar1;
  dVar11 = dVar1 * dVar12 - dVar11 * dVar7;
  auVar6._8_4_ = SUB84(dVar11,0);
  auVar6._0_8_ = dVar13;
  auVar6._12_4_ = (int)((ulong)dVar11 >> 0x20);
  pVVar2[1].x = dVar13;
  pVVar2[1].y = (double)auVar6._8_8_;
  pVVar2[1].z = dVar14 * dVar7 - dVar8 * dVar12;
  return;
}

Assistant:

void Face::getAxes( vector<Vector3D>& axes ) const
  {
    axes.resize(3);

    // Set the Z direction to the face normal
    axes[2] = normal();

    if( degree() == 4 )
    {
      // For quads, we'll try to roughly align the X direction
      // with one of the principal axes of the quad.
      HalfedgeCIter h = halfedge();
      Vector3D p0 = h->vertex()->position; h = h->next();
      Vector3D p1 = h->vertex()->position; h = h->next();
      Vector3D p2 = h->vertex()->position; h = h->next();
      Vector3D p3 = h->vertex()->position;

      axes[0] = ( p1 - p0 ) + ( p2 - p3 );
    }
    else
    {
      // Otherwise, we'll just use an arbitrary edge
      // to determine the direction of the X-axis.
      HalfedgeCIter h = halfedge();
      Vector3D p0 = h->vertex()->position; h = h->next();
      Vector3D p1 = h->vertex()->position;

      axes[0] = p1 - p0;
    }

    // Make X orthonormal to Z
    axes[0] -= dot( axes[0], axes[2] )*axes[2];
    axes[0].normalize();

    // Choose the Y direction so that X x Y = Z
    axes[1] = cross( axes[2], axes[0] );
  }